

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRMiner.cpp
# Opt level: O1

void dgrminer::run_DGRMiner
               (string *input_file,string *output_file,double min_support,double min_confidence,
               bool compute_confidence,int window_size,string *str_timeabstraction,
               bool search_for_anomalies,double min_anomaly_outlierness,bool verbose,
               bool new_measures,bool heuristic_mis)

{
  pointer pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  PartialUnion pu_00;
  string output_file_00;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int snapshots;
  int support_as_absolute;
  long *plVar9;
  array<int,_8UL> *__args;
  long lVar10;
  long lVar11;
  long lVar12;
  vector<int,_std::allocator<int>_> *graph_ids;
  ulong uVar13;
  double dVar14;
  undefined1 uVar15;
  undefined1 auStack_928 [12];
  undefined4 uStack_914;
  undefined8 uStack_910;
  FileReader fr;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> initial_patterns;
  array<int,_10UL> i_p;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> init_pattern;
  undefined8 uStack_890;
  vector<int,_std::allocator<int>_> antecedent_graph_ids;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> starting_edges;
  undefined8 uStack_840;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> newedges;
  pointer puStack_810;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  initial_patterns_occurrences;
  vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
  adjacency_lists;
  undefined1 *local_7d8;
  undefined1 in_stack_fffffffffffff830;
  undefined1 in_stack_fffffffffffff838;
  undefined1 in_stack_fffffffffffff840;
  string local_7b8;
  string local_798;
  set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  edges_set;
  _Rb_tree<dgrminer::labeled_node_time,_dgrminer::labeled_node_time,_std::_Identity<dgrminer::labeled_node_time>,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
  local_748;
  PartialUnion pu;
  results_crate results;
  results_crate_anomalies results_anomalies;
  set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
  labeled_nodes;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_430;
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_400;
  _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  _Stack_3d0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  _Stack_3a0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  _Stack_370;
  int local_340;
  int iStack_33c;
  vector<int,_std::allocator<int>_> vStack_338;
  bool local_320;
  bool bStack_31f;
  vector<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  vStack_318;
  PartialUnion local_300;
  PartialUnion local_198;
  
  uStack_914 = (undefined4)((ulong)min_support >> 0x20);
  iVar5 = std::__cxx11::string::compare((char *)str_timeabstraction);
  iVar6 = std::__cxx11::string::compare((char *)str_timeabstraction);
  memset(&results.result_nodes,0,0xa8);
  memset(&results_anomalies.anomaly_result_nodes,0,0x90);
  results.saved_instances = 0;
  results_anomalies.anomaly_saved_instances = 0;
  PartialUnion::PartialUnion(&pu);
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"--- STARTING DGRMINER",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"--- READING FILE",0x10);
    }
  }
  pcVar1 = (input_file->_M_dataplus)._M_p;
  local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_798,pcVar1,pcVar1 + input_file->_M_string_length);
  FileReader::read_dynamic_graph_from_file
            ((PartialUnion *)&labeled_nodes,&fr,&local_798,window_size,search_for_anomalies);
  pu.value = labeled_nodes._M_t._M_impl._0_4_;
  std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::operator=
            (&pu.nodes,
             (vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_> *)
             &labeled_nodes._M_t._M_impl.super__Rb_tree_header);
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator=
            (&pu.edges,
             (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             &labeled_nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::operator=(&pu.labelEncoding._M_t,&local_430);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&pu.encodingLabel._M_t,&local_400);
  std::
  _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  ::operator=(&pu.labelIsChange._M_t,&_Stack_3d0);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=(&pu.antecedentLabelsOfLabels._M_t,&_Stack_3a0);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=(&pu.dummyLabelsOfLabels._M_t,&_Stack_370);
  pu.number_of_labels = local_340;
  pu.number_of_dynamic_graphs = iStack_33c;
  std::vector<int,_std::allocator<int>_>::operator=(&pu.mappingSnapshotsToGraphs,&vStack_338);
  pu.new_measures = local_320;
  pu.heuristic_mis = bStack_31f;
  std::
  vector<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  ::operator=(&pu.rawAdjacencyLists,&vStack_318);
  PartialUnion::~PartialUnion((PartialUnion *)&labeled_nodes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != &local_798.field_2) {
    operator_delete(local_798._M_dataplus._M_p);
  }
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(DONE)",6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
  }
  PartialUnion::printDimensions(&pu);
  iVar7 = PartialUnion::getNumberOfDynamicGraphs(&pu);
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Number of dynamic graphs: ",0x1a);
    plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
  }
  PartialUnion::setNewMeasuresAndHeuristics(&pu,new_measures,heuristic_mis);
  iVar7 = PartialUnion::getNumberOfDynamicGraphs(&pu);
  iVar8 = PartialUnion::getNumberOfNodes(&pu);
  if (iVar8 == 0) {
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"The union graph has no nodes! Quitting...",0x29);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
    }
    goto LAB_001067cd;
  }
  snapshots = PartialUnion::getNumberOfSnapshots(&pu);
  iVar8 = snapshots;
  if (1 < iVar7 && !new_measures) {
    iVar8 = PartialUnion::queryMappingSnapshotsToGraphs(&pu,snapshots + -1);
    iVar8 = iVar8 + 1;
  }
  if (!new_measures) {
    min_support = min_support * (double)iVar8;
  }
  dVar14 = ceil(min_support);
  support_as_absolute = (int)dVar14;
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Max absolute support: ",0x16);
    plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Number of snapshots: ",0x15);
      plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,snapshots);
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Min support (absolute): ",0x18);
        plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,support_as_absolute);
        std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
        std::ostream::put((char)plVar9);
        std::ostream::flush();
      }
    }
  }
  if (iVar5 == 0) {
    PartialUnion::performSimpleTimeAbstraction(&pu);
  }
  else if (iVar6 == 0) {
    PartialUnion::performSimpleNodeTimeAbstraction(&pu);
  }
  if (verbose && !compute_confidence) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"--- REMOVING INFREQUENT VERTICES",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
  }
  PartialUnion::computeFrequentVerticesAndRemoveTheInfrequentOnes
            (&pu,support_as_absolute,min_confidence,compute_confidence,&results,&results_anomalies,
             iVar8,1 < iVar7,search_for_anomalies,min_anomaly_outlierness);
  if (verbose && !compute_confidence) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--- (DONE)",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"--- REMOVING INVALID EDGES",0x1a);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
    }
  }
  PartialUnion::compute_labeled_nodes(&labeled_nodes,&pu);
  if (!compute_confidence) {
    std::
    _Rb_tree<dgrminer::labeled_node_time,_dgrminer::labeled_node_time,_std::_Identity<dgrminer::labeled_node_time>,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
    ::_Rb_tree(&local_748,&labeled_nodes._M_t);
    PartialUnion::eraseInvalidEdges
              (&pu,(set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
                    *)&local_748);
    std::
    _Rb_tree<dgrminer::labeled_node_time,_dgrminer::labeled_node_time,_std::_Identity<dgrminer::labeled_node_time>,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
    ::~_Rb_tree(&local_748);
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--- (DONE)",10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"--- REMOVING INFREQUENT EDGES",0x1d);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
        std::ostream::put('p');
        std::ostream::flush();
      }
    }
  }
  newedges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  newedges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  newedges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  edges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &edges_set._M_t._M_impl.super__Rb_tree_header._M_header;
  edges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  edges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  edges_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  edges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       edges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  PartialUnion::compute_labeled_edges(&pu,&newedges,&edges_set,&labeled_nodes,true);
  if (compute_confidence) {
LAB_0010611f:
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"--- BUILDING ADJACENCY LISTS ",0x1d);
    }
  }
  else {
    PartialUnion::removeInfrequentEdges(&pu,&newedges,&edges_set,support_as_absolute,1 < iVar7,true)
    ;
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--- (DONE)",10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
      goto LAB_0010611f;
    }
  }
  PartialUnion::createAdjacencyLists(&adjacency_lists,&pu,&newedges,snapshots);
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(DONE)",6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"--- GETTING INITIAL PATTERNS ",0x1d);
    }
  }
  initial_patterns.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  initial_patterns.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  initial_patterns.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  initial_patterns_occurrences.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  initial_patterns_occurrences.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  initial_patterns_occurrences.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  getFrequentInitialPatterns
            (&edges_set,&initial_patterns,&initial_patterns_occurrences,support_as_absolute,
             1 < iVar7,&pu);
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(DONE)",6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
  }
  antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  i_p._M_elems[0] = 0;
  if (0 < snapshots) {
    do {
      if (antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&antecedent_graph_ids,
                   (iterator)
                   antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,i_p._M_elems);
      }
      else {
        *antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish = i_p._M_elems[0];
        antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      i_p._M_elems[0] = i_p._M_elems[0] + 1;
    } while (i_p._M_elems[0] < snapshots);
  }
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"--- FINDING FREQUENT PATTERNS (STARTING FROM ",0x2d);
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," INITIAL PATTERNS):",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--- (",5);
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," SINGLE-VERTEX PATTERNS ALREADY FOUND)",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
  }
  PartialUnion::PartialUnion(&local_198,&pu);
  pcVar1 = (output_file->_M_dataplus)._M_p;
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7b8,pcVar1,pcVar1 + output_file->_M_string_length);
  printResultsToFiles(&results,&results_anomalies,&local_198,&local_7b8,1 < iVar7,compute_confidence
                      ,search_for_anomalies,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p);
  }
  PartialUnion::~PartialUnion(&local_198);
  if (initial_patterns.
      super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      initial_patterns.
      super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar10 = 1;
    uVar13 = 0;
    do {
      starting_edges.
      super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      starting_edges.
      super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      starting_edges.
      super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar12 = 0;
      lVar11 = lVar10;
      do {
        __args = (array<int,_8UL> *)
                 ((long)(initial_patterns.
                         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar12);
        if (starting_edges.
            super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl
            .super__Vector_impl_data._M_finish ==
            starting_edges.
            super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>::
          _M_realloc_insert<std::array<int,8ul>const&>
                    ((vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>> *)
                     &starting_edges,
                     (iterator)
                     starting_edges.
                     super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,__args);
        }
        else {
          uVar2 = *(undefined8 *)__args->_M_elems;
          uVar3 = *(undefined8 *)(__args->_M_elems + 2);
          uVar4 = *(undefined8 *)(__args->_M_elems + 6);
          *(undefined8 *)
           ((starting_edges.
             super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->_M_elems + 4) =
               *(undefined8 *)(__args->_M_elems + 4);
          *(undefined8 *)
           ((starting_edges.
             super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->_M_elems + 6) = uVar4;
          *(undefined8 *)
           (starting_edges.
            super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl
            .super__Vector_impl_data._M_finish)->_M_elems = uVar2;
          *(undefined8 *)
           ((starting_edges.
             super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->_M_elems + 2) = uVar3;
          starting_edges.
          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
          super__Vector_impl_data._M_finish =
               starting_edges.
               super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        lVar12 = lVar12 + 0x20;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
      init_pattern.
      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      init_pattern.
      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      init_pattern.
      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      i_p._M_elems[0] = 0;
      i_p._M_elems[1] = 1;
      i_p._M_elems[2] =
           initial_patterns.
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
           super__Vector_impl_data._M_start[uVar13]._M_elems[0];
      i_p._M_elems[3] =
           initial_patterns.
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
           super__Vector_impl_data._M_start[uVar13]._M_elems[1];
      i_p._M_elems[4] =
           initial_patterns.
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
           super__Vector_impl_data._M_start[uVar13]._M_elems[2];
      i_p._M_elems[5] =
           initial_patterns.
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
           super__Vector_impl_data._M_start[uVar13]._M_elems[3];
      i_p._M_elems[6] =
           initial_patterns.
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
           super__Vector_impl_data._M_start[uVar13]._M_elems[4];
      i_p._M_elems[7] =
           initial_patterns.
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
           super__Vector_impl_data._M_start[uVar13]._M_elems[5];
      i_p._M_elems[8] =
           initial_patterns.
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
           super__Vector_impl_data._M_start[uVar13]._M_elems[6];
      i_p._M_elems[9] =
           initial_patterns.
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
           super__Vector_impl_data._M_start[uVar13]._M_elems[7];
      std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>::
      _M_realloc_insert<std::array<int,10ul>const&>
                ((vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *)&init_pattern,
                 (iterator)0x0,&i_p);
      graph_ids = initial_patterns_occurrences.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar13;
      PartialUnion::PartialUnion(&local_300,&pu);
      pcVar1 = (output_file->_M_dataplus)._M_p;
      uVar15 = 0x30;
      local_7d8 = &stack0xfffffffffffff838;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7d8,pcVar1,pcVar1 + output_file->_M_string_length);
      pu_00.nodes.super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)&antecedent_graph_ids;
      pu_00._0_8_ = &local_300;
      pu_00.nodes.super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_1_ = 1 < iVar7;
      pu_00.nodes.super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      pu_00.nodes.super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = search_for_anomalies;
      pu_00.nodes.super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
      pu_00.edges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)&local_7d8;
      pu_00.edges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_1_ = verbose;
      pu_00.edges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      pu_00.edges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = new_measures;
      pu_00.edges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
      pu_00.labelEncoding._M_t._M_impl._0_1_ = heuristic_mis;
      pu_00.labelEncoding._M_t._M_impl._1_7_ = 0;
      pu_00.labelEncoding._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = uVar15;
      pu_00.labelEncoding._M_t._M_impl.super__Rb_tree_header._M_header._1_7_ = 0x1066;
      pu_00.labelEncoding._M_t._M_impl.super__Rb_tree_header._M_header._8_12_ = auStack_928;
      pu_00.labelEncoding._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ = iVar7;
      pu_00.labelEncoding._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ =
           support_as_absolute;
      pu_00.labelEncoding._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ = uStack_914;
      pu_00.labelEncoding._M_t._M_impl.super__Rb_tree_header._M_node_count = uStack_910;
      pu_00.encodingLabel._M_t._M_impl._0_4_ = iVar8;
      pu_00.encodingLabel._M_t._M_impl._4_4_ = 0;
      pu_00.encodingLabel._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ =
           compute_confidence;
      pu_00.encodingLabel._M_t._M_impl.super__Rb_tree_header._M_header._1_7_ = 0;
      pu_00.encodingLabel._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ = verbose;
      pu_00.encodingLabel._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._1_7_ = 0;
      pu_00.encodingLabel._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ =
           search_for_anomalies;
      pu_00.encodingLabel._M_t._M_impl.super__Rb_tree_header._M_header._M_left._1_7_ = 0;
      pu_00.encodingLabel._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)
           initial_patterns.
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
      pu_00.encodingLabel._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)initial_patterns.
                   super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      pu_00.labelIsChange._M_t._M_impl._0_8_ =
           initial_patterns.
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      pu_00.labelIsChange._M_t._M_impl.super__Rb_tree_header._M_header._M_color = i_p._M_elems[0];
      pu_00.labelIsChange._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = i_p._M_elems[1];
      pu_00.labelIsChange._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
           i_p._M_elems[2];
      pu_00.labelIsChange._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
           i_p._M_elems[3];
      pu_00.labelIsChange._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           i_p._M_elems[4];
      pu_00.labelIsChange._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
           i_p._M_elems[5];
      pu_00.labelIsChange._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ =
           i_p._M_elems[6];
      pu_00.labelIsChange._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
           i_p._M_elems[7];
      pu_00.labelIsChange._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = i_p._M_elems[8];
      pu_00.labelIsChange._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = i_p._M_elems[9];
      pu_00.antecedentLabelsOfLabels._M_t._M_impl._0_8_ =
           init_pattern.
           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
      pu_00.antecedentLabelsOfLabels._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           init_pattern.
           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      pu_00.antecedentLabelsOfLabels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           init_pattern.
           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      pu_00.antecedentLabelsOfLabels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)uStack_890;
      pu_00.antecedentLabelsOfLabels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)
           antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
      pu_00.antecedentLabelsOfLabels._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      pu_00.dummyLabelsOfLabels._M_t._M_impl._0_8_ =
           antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      pu_00.dummyLabelsOfLabels._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = output_file;
      pu_00.dummyLabelsOfLabels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)min_confidence;
      pu_00.dummyLabelsOfLabels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)min_anomaly_outlierness;
      pu_00.dummyLabelsOfLabels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)
           starting_edges.
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
      pu_00.dummyLabelsOfLabels._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)starting_edges.
                   super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      pu_00._296_8_ =
           starting_edges.
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      pu_00.mappingSnapshotsToGraphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)uStack_840;
      pu_00.mappingSnapshotsToGraphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = heuristic_mis;
      pu_00.mappingSnapshotsToGraphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = 0;
      pu_00.mappingSnapshotsToGraphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = new_measures;
      pu_00.mappingSnapshotsToGraphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
      pu_00._328_8_ =
           newedges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      pu_00.rawAdjacencyLists.
      super__Vector_base<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)newedges.
                    super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      pu_00.rawAdjacencyLists.
      super__Vector_base<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)newedges.
                    super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pu_00.rawAdjacencyLists.
      super__Vector_base<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = puStack_810;
      output_file_00.field_2._8_8_ = local_7d8;
      output_file_00._0_24_ =
           adjacency_lists.
           super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
           ._M_impl.super__Vector_impl_data;
      DGRSubgraphMining(&adjacency_lists,graph_ids,&init_pattern,support_as_absolute,&starting_edges
                        ,&results,&results_anomalies,iVar8,min_confidence,compute_confidence,pu_00,
                        initial_patterns_occurrences.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        initial_patterns_occurrences.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish._0_1_,
                        initial_patterns_occurrences.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_,
                        min_anomaly_outlierness,output_file_00,(bool)in_stack_fffffffffffff830,
                        (bool)in_stack_fffffffffffff838,(bool)in_stack_fffffffffffff840);
      if (local_7d8 != &stack0xfffffffffffff838) {
        operator_delete(local_7d8);
      }
      PartialUnion::~PartialUnion(&local_300);
      if (init_pattern.
          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(init_pattern.
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (starting_edges.
          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(starting_edges.
                        super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar13 = uVar13 + 1;
      lVar10 = lVar10 + 1;
    } while (uVar13 < (ulong)((long)initial_patterns.
                                    super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)initial_patterns.
                                    super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FINISHED.",9);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
  }
  if (antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&initial_patterns_occurrences);
  if (initial_patterns.
      super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(initial_patterns.
                    super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::~vector
            (&adjacency_lists);
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~_Rb_tree(&edges_set._M_t);
  if (newedges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(newedges.
                    super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<dgrminer::labeled_node_time,_dgrminer::labeled_node_time,_std::_Identity<dgrminer::labeled_node_time>,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
  ::~_Rb_tree(&labeled_nodes._M_t);
LAB_001067cd:
  PartialUnion::~PartialUnion(&pu);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&results_anomalies.anomaly_occurrences);
  if (results_anomalies.anomaly_outlierness.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(results_anomalies.anomaly_outlierness.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (results_anomalies.anomaly_id_of_explanation_pattern.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(results_anomalies.anomaly_id_of_explanation_pattern.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start);
  }
  if (results_anomalies.anomaly_id_of_anomalous_pattern.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(results_anomalies.anomaly_id_of_anomalous_pattern.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start);
  }
  if (results_anomalies.anomaly_result_edges.
      super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(results_anomalies.anomaly_result_edges.
                    super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (results_anomalies.anomaly_result_nodes.
      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(results_anomalies.anomaly_result_nodes.
                    super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&results.occurrences_antecedent);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&results.occurrences);
  if (results.confidence.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(results.confidence.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (results.support.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(results.support.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (results.support_absolute.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(results.support_absolute.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (results.result_edges.
      super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(results.result_edges.
                    super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (results.result_nodes.
      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(results.result_nodes.
                    super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void run_DGRMiner(std::string input_file, std::string output_file, double min_support, double min_confidence,
					  bool compute_confidence, int window_size, std::string str_timeabstraction,
					  bool search_for_anomalies, double min_anomaly_outlierness, bool verbose, bool new_measures, bool heuristic_mis)
	{
		// set abstractions appropriately
		bool simple_time_abstraction = (str_timeabstraction == "bin_all");
		bool simple_node_time_abstraction = (str_timeabstraction == "bin_nodes");

		// save result patterns in the results_crate
		results_crate results;
		results_crate_anomalies results_anomalies;
		results.saved_instances = 0;
		results_anomalies.anomaly_saved_instances = 0;

		bool debugPrint = true;


		FileReader fr;
		PartialUnion pu;

		debug_println(verbose, "--- STARTING DGRMINER");
		debug_print(verbose, "--- READING FILE");
		pu = fr.read_dynamic_graph_from_file(input_file, window_size, search_for_anomalies);
		debug_println(verbose, "(DONE)");
		pu.printDimensions();
		debug_println(verbose, "Number of dynamic graphs: ", pu.getNumberOfDynamicGraphs());

	  	pu.setNewMeasuresAndHeuristics(new_measures, heuristic_mis);

		bool set_of_graphs = pu.getNumberOfDynamicGraphs() > 1;

		if (pu.getNumberOfNodes() == 0)
		{
			debug_println(verbose, "The union graph has no nodes! Quitting...");
			return;
		}

		int snapshots = pu.getNumberOfSnapshots();
		int max_absolute_support = snapshots;
		if (set_of_graphs && !new_measures) {
			max_absolute_support = pu.queryMappingSnapshotsToGraphs(snapshots - 1) + 1;
		}

	  	if (!new_measures) {
		  	min_support = max_absolute_support * min_support;
		}

	  	// what is the minimum support expressed by an absolute value
		auto min_absolute_support = (int) ceil(min_support);

		debug_println(verbose, "Max absolute support: ", max_absolute_support);
		debug_println(verbose, "Number of snapshots: ", snapshots);
		debug_println(verbose, "Min support (absolute): ", min_absolute_support);

		if (simple_time_abstraction)
		{
			pu.performSimpleTimeAbstraction();
		}
		else if (simple_node_time_abstraction)
		{
			pu.performSimpleNodeTimeAbstraction();
		}

		// we cannot remove infrequent vertices and edges if we are computing confidence (= if we are computing antecedents!!!! - also when computing anomalies)
		if (!compute_confidence)
		{
			debug_println(verbose, "--- REMOVING INFREQUENT VERTICES");
		}

		// compute the frequent vertices and remove the infrequent ones,
        // save the frequent ones into results
		pu.computeFrequentVerticesAndRemoveTheInfrequentOnes(min_absolute_support, min_confidence, compute_confidence,
															 &results, &results_anomalies, max_absolute_support,
															 set_of_graphs,
															 search_for_anomalies, min_anomaly_outlierness);
		if (!compute_confidence)
		{
			debug_println(verbose, "--- (DONE)");
			debug_println(verbose, "--- REMOVING INVALID EDGES");
		}


		std::set<labeled_node_time> labeled_nodes = pu.compute_labeled_nodes();
		if (!compute_confidence)
		{
			pu.eraseInvalidEdges(labeled_nodes);
			debug_println(verbose, "--- (DONE)");

			// remove infrequent edges
			debug_println(verbose, "--- REMOVING INFREQUENT EDGES");
		}

		std::vector<std::array<int, 8>> newedges;  // will be used for adjacency info
		std::set<labeled_edge_with_occurrences> edges_set; // this contains edges flipped to be smaller, used for counting support of the edges
		pu.compute_labeled_edges(newedges, edges_set, labeled_nodes, debugPrint); // computes newedges, edges_set

		if (!compute_confidence)
		{
			pu.removeInfrequentEdges(newedges, edges_set, min_absolute_support, set_of_graphs, debugPrint);
			debug_println(verbose, "--- (DONE)");
		}

		// build adjacency lists (one list for each snapshot):
		debug_print(verbose, "--- BUILDING ADJACENCY LISTS ");
		std::vector<AdjacencyListCrate> adjacency_lists = pu.createAdjacencyLists(newedges, snapshots);
		debug_println(verbose, "(DONE)");


		// create initial patterns:
		debug_print(verbose, "--- GETTING INITIAL PATTERNS ");
		std::vector<std::array<int, 8>> initial_patterns;
		std::vector<std::vector<int>> initial_patterns_occurrences;
		getFrequentInitialPatterns(edges_set, initial_patterns, initial_patterns_occurrences, min_absolute_support,
								   set_of_graphs, pu); // fills initial_patterns, initial_patterns_occurrences
		debug_println(verbose, "(DONE)");


		vector<int> antecedent_graph_ids;
		for (int i = 0; i < snapshots; i++)
		{
			antecedent_graph_ids.push_back(i);

		}

		debug_println(verbose, "--- FINDING FREQUENT PATTERNS (STARTING FROM ", initial_patterns.size(),
					  " INITIAL PATTERNS):");
		debug_println(verbose, "--- (", results.result_nodes.size(), " SINGLE-VERTEX PATTERNS ALREADY FOUND)");

		printResultsToFiles(&results, &results_anomalies, pu, output_file, set_of_graphs, compute_confidence,
							search_for_anomalies, false);


		for (size_t i = 0; i < initial_patterns.size(); i++)
		{
			std::vector<std::array<int, 8>> starting_edges;
			for (size_t j = 0; j <= i; j++)
			{
				starting_edges.push_back(initial_patterns[j]);
			}
			std::vector<std::array<int, 10>> init_pattern;
			std::array<int, 10> i_p = {
					0,
					1,
					initial_patterns[i][0],
					initial_patterns[i][1],
					initial_patterns[i][2],
					initial_patterns[i][3],
					initial_patterns[i][4],
					initial_patterns[i][5],
					initial_patterns[i][6],
					initial_patterns[i][7]
			};

			init_pattern.push_back(i_p);

			DGRSubgraphMining(adjacency_lists, initial_patterns_occurrences[i], init_pattern, min_absolute_support,
							  starting_edges, &results, &results_anomalies,
							  max_absolute_support, min_confidence, compute_confidence, pu, antecedent_graph_ids,
							  set_of_graphs, search_for_anomalies, min_anomaly_outlierness, output_file, verbose, new_measures,
							  heuristic_mis);
		}

		debug_println(verbose, "FINISHED.");
	}